

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O2

void __thiscall
Units_scalingFactorSelfReferencingUnits2_Test::TestBody
          (Units_scalingFactorSelfReferencingUnits2_Test *this)

{
  element_type *peVar1;
  char *pcVar2;
  allocator<char> local_ab;
  allocator<char> local_aa;
  allocator<char> local_a9;
  AssertionResult gtest_ar;
  double local_88 [4];
  double local_68 [4];
  UnitsPtr X;
  UnitsPtr mX;
  ModelPtr model;
  
  libcellml::Model::create();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar,"X",(allocator<char> *)local_88);
  libcellml::Units::create((string *)&X);
  std::__cxx11::string::~string((string *)&gtest_ar);
  peVar1 = X.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar,"mole",(allocator<char> *)local_88);
  libcellml::Units::addUnit((string *)peVar1);
  std::__cxx11::string::~string((string *)&gtest_ar);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar,"mX",(allocator<char> *)local_88);
  libcellml::Units::create((string *)&mX);
  std::__cxx11::string::~string((string *)&gtest_ar);
  std::__cxx11::string::string<std::allocator<char>>((string *)&gtest_ar,"X",&local_ab);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_88,"milli",&local_a9);
  pcVar2 = "";
  std::__cxx11::string::string<std::allocator<char>>((string *)local_68,"",&local_aa);
  libcellml::Units::addUnit
            ((string *)mX.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             (string *)&gtest_ar,1.0,1.0,(string *)local_88);
  std::__cxx11::string::~string((string *)local_68);
  std::__cxx11::string::~string((string *)local_88);
  std::__cxx11::string::~string((string *)&gtest_ar);
  libcellml::Model::addUnits
            ((shared_ptr *)
             model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::Model::addUnits
            ((shared_ptr *)
             model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  local_88[0] = 1000.0;
  local_68[0] = (double)libcellml::Units::scalingFactor((shared_ptr *)&mX,(shared_ptr *)&X,true);
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)&gtest_ar,"1000.0","libcellml::Units::scalingFactor(mX, X)",local_88,
             local_68);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)local_88);
    if (gtest_ar.message_.ptr_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x9ea,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_68,(Message *)local_88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_68);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_88);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar,"litre",(allocator<char> *)local_68);
  pcVar2 = "";
  std::__cxx11::string::string<std::allocator<char>>((string *)local_88,"",&local_ab);
  libcellml::Units::addUnit
            ((string *)X.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             -3.0,(string *)&gtest_ar);
  std::__cxx11::string::~string((string *)local_88);
  std::__cxx11::string::~string((string *)&gtest_ar);
  local_88[0] = 1000.0;
  local_68[0] = (double)libcellml::Units::scalingFactor((shared_ptr *)&mX,(shared_ptr *)&X,true);
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)&gtest_ar,"1000.0","libcellml::Units::scalingFactor(mX, X)",local_88,
             local_68);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)local_88);
    if (gtest_ar.message_.ptr_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x9ee,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_68,(Message *)local_88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_68);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_88);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&mX.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&X.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

TEST(Units, scalingFactorSelfReferencingUnits2)
{
    auto model = libcellml::Model::create();
    auto X = libcellml::Units::create("X");
    X->addUnit("mole");
    auto mX = libcellml::Units::create("mX");
    mX->addUnit("X", "milli");
    model->addUnits(X);
    model->addUnits(mX);

    EXPECT_EQ(1000.0, libcellml::Units::scalingFactor(mX, X));

    X->addUnit("litre", -3.0);

    EXPECT_EQ(1000.0, libcellml::Units::scalingFactor(mX, X));
}